

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosLog.h
# Opt level: O2

void adios2::helper::Throw<std::invalid_argument>
               (string *component,string *source,string *activity,string *message,int commRank)

{
  invalid_argument *this;
  string m;
  
  adios2::helper::MakeMessage
            ((string *)&m,(string *)component,(string *)source,(string *)activity,(int)message,
             (LogMode)commRank);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,(string *)&m);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Throw(const std::string &component, const std::string &source, const std::string &activity,
           const std::string &message, const int commRank = -1)
{
    auto m = MakeMessage(component, source, activity, message, commRank, LogMode::EXCEPTION);
    throw(T(m));
}